

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

Vec_Wec_t *
Acec_ManCollectCarryRootSets
          (Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vCarryMap,Vec_Int_t *vXors,Vec_Int_t *vXorRoots,
          Vec_Int_t *vCarryRoots)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Bit_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *vXorMap_00;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vXorMap;
  int CarryRoot;
  int XorRoot;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vXorSet;
  Vec_Bit_t *vIsCarryRoot;
  Vec_Int_t *vCarryRootSet;
  Vec_Wec_t *vCarryRootSets;
  Vec_Int_t *vCarryRoots_local;
  Vec_Int_t *vXorRoots_local;
  Vec_Int_t *vXors_local;
  Vec_Int_t *vCarryMap_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_WecAlloc(100);
  pVVar3 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_BitStart(iVar1);
  p_02 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  vXorMap_00 = Vec_IntStartFull(iVar1);
  for (XorRoot = 0; iVar1 = Vec_IntSize(vXors), XorRoot << 2 < iVar1; XorRoot = XorRoot + 1) {
    iVar1 = Vec_IntEntry(vXors,XorRoot << 2);
    Vec_IntWriteEntry(vXorMap_00,iVar1,XorRoot);
  }
  for (XorRoot = 0; iVar1 = Vec_IntSize(vCarryRoots), XorRoot < iVar1; XorRoot = XorRoot + 1) {
    iVar1 = Vec_IntEntry(vCarryRoots,XorRoot);
    Vec_BitWriteEntry(p_01,iVar1,1);
  }
  XorRoot = 0;
  do {
    iVar1 = Vec_IntSize(vXorRoots);
    if (iVar1 <= XorRoot) {
      Vec_IntFree(pVVar3);
      Vec_IntFree(p_02);
      Vec_IntFree(vXorMap_00);
      for (CarryRoot = 0; iVar1 = Vec_IntSize(vCarryRoots), CarryRoot < iVar1;
          CarryRoot = CarryRoot + 1) {
        iVar1 = Vec_IntEntry(vCarryRoots,CarryRoot);
        iVar2 = Vec_BitEntry(p_01,iVar1);
        if ((iVar2 != 0) && (iVar2 = Acec_ManCheckCarryMap(p,iVar1,vAdds,vCarryMap), iVar2 != 0)) {
          Vec_WecPushLevel(p_00);
          pVVar3 = Vec_WecPushLevel(p_00);
          Vec_IntFill(pVVar3,1,iVar1);
          Vec_WecPushLevel(p_00);
          Vec_WecPushLevel(p_00);
          Vec_WecPushLevel(p_00);
        }
      }
      Vec_BitFree(p_01);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vXorRoots,XorRoot);
    Vec_IntClear(p_02);
    Vec_IntClear(pVVar3);
    Gia_ManIncrementTravId(p);
    Acec_ManCountXorTreeInputs_rec(p,iVar1,vXors,vXorMap_00,p_01,pVVar3,p_02);
    for (CarryRoot = 0; iVar1 = Vec_IntSize(pVVar3), CarryRoot < iVar1; CarryRoot = CarryRoot + 1) {
      iVar1 = Vec_IntEntry(pVVar3,CarryRoot);
      iVar1 = Acec_ManCheckCarryMap(p,iVar1,vAdds,vCarryMap);
      if (iVar1 != 0) break;
    }
    iVar1 = Vec_IntSize(pVVar3);
    if (CarryRoot != iVar1) {
      Vec_IntSort(pVVar3,0);
      pVVar4 = Vec_WecPushLevel(p_00);
      Vec_IntAppend(pVVar4,p_02);
      pVVar4 = Vec_WecPushLevel(p_00);
      Vec_IntAppend(pVVar4,pVVar3);
      Vec_WecPushLevel(p_00);
      Vec_WecPushLevel(p_00);
      Vec_WecPushLevel(p_00);
      for (CarryRoot = 0; iVar1 = Vec_IntSize(pVVar3), CarryRoot < iVar1; CarryRoot = CarryRoot + 1)
      {
        iVar1 = Vec_IntEntry(pVVar3,CarryRoot);
        iVar2 = Vec_BitEntry(p_01,iVar1);
        if (iVar2 == 0) {
          __assert_fail("Vec_BitEntry(vIsCarryRoot, CarryRoot)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPool.c"
                        ,0x9b,
                        "Vec_Wec_t *Acec_ManCollectCarryRootSets(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        Vec_BitWriteEntry(p_01,iVar1,0);
      }
    }
    XorRoot = XorRoot + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Acec_ManCollectCarryRootSets( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vCarryMap, Vec_Int_t * vXors, Vec_Int_t * vXorRoots, Vec_Int_t * vCarryRoots )
{
    Vec_Wec_t * vCarryRootSets = Vec_WecAlloc( 100 ); // XorBoxes, CarryRoots, AdderBoxes, Ins/Ranks, Outs/Ranks
    Vec_Int_t * vCarryRootSet = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIsCarryRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vXorSet = Vec_IntAlloc( 100 ), * vLevel;
    int i, k, XorRoot, CarryRoot;
    // map XORs into their cuts
    Vec_Int_t * vXorMap = Vec_IntStartFull( Gia_ManObjNum(p) );  
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_IntWriteEntry( vXorMap, Vec_IntEntry(vXors, 4*i), i );
    // create carry root marks
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, i )
        Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 1 );
    // collect carry roots attached to each XOR root
    Vec_IntForEachEntry( vXorRoots, XorRoot, i )
    {
        Vec_IntClear( vXorSet );
        Vec_IntClear( vCarryRootSet );
        Gia_ManIncrementTravId( p );
        Acec_ManCountXorTreeInputs_rec( p, XorRoot, vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
        // skip trivial
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
            if ( Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
                break;
        if ( k == Vec_IntSize(vCarryRootSet) )
            continue;
        Vec_IntSort( vCarryRootSet, 0 );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vXorSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vCarryRootSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        // unmark carry root set
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
        {
            assert( Vec_BitEntry(vIsCarryRoot, CarryRoot) );
            Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 0 );
        }
    }
    Vec_IntFree( vCarryRootSet );
    Vec_IntFree( vXorSet );
    Vec_IntFree( vXorMap );
    // collect unmarked carry roots
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, k )
    {
        if ( !Vec_BitEntry(vIsCarryRoot, CarryRoot) )
            continue;
        if ( !Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
            continue;
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntFill( vLevel, 1, CarryRoot );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
    }
    Vec_BitFree( vIsCarryRoot );
    return vCarryRootSets;
}